

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DVector3 * __thiscall
AActor::Vec2OffsetZ(DVector3 *__return_storage_ptr__,AActor *this,double dx,double dy,double atz,
                   bool absolute)

{
  double dVar1;
  double dVar2;
  undefined1 local_48 [8];
  DVector2 v;
  bool absolute_local;
  double atz_local;
  double dy_local;
  double dx_local;
  AActor *this_local;
  
  v.Y._7_1_ = absolute;
  if (absolute) {
    dVar1 = X(this);
    dVar2 = Y(this);
    TVector3<double>::TVector3(__return_storage_ptr__,dVar1 + dx,dVar2 + dy,atz);
  }
  else {
    dVar1 = X(this);
    dVar2 = Y(this);
    P_GetOffsetPosition(dVar1,dVar2,dx,dy);
    TVector3<double>::TVector3(__return_storage_ptr__,(Vector2 *)local_48,atz);
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 Vec2OffsetZ(double dx, double dy, double atz, bool absolute = false)
	{
		if (absolute)
		{
			return{ X() + dx, Y() + dy, atz };
		}
		else
		{
			DVector2 v = P_GetOffsetPosition(X(), Y(), dx, dy);
			return DVector3(v, atz);
		}
	}